

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O0

void cJSON_InitHooks(cJSON_Hooks *hooks)

{
  _func_void_void_ptr *local_20;
  _func_void_ptr_size_t *local_18;
  cJSON_Hooks *hooks_local;
  
  if (hooks == (cJSON_Hooks *)0x0) {
    cJSON_malloc = malloc;
    cJSON_free = free;
  }
  else {
    if (hooks->malloc_fn == (_func_void_ptr_size_t *)0x0) {
      local_18 = malloc;
    }
    else {
      local_18 = hooks->malloc_fn;
    }
    cJSON_malloc = local_18;
    if (hooks->free_fn == (_func_void_void_ptr *)0x0) {
      local_20 = free;
    }
    else {
      local_20 = hooks->free_fn;
    }
    cJSON_free = local_20;
  }
  return;
}

Assistant:

void cJSON_InitHooks(cJSON_Hooks* hooks)
{
    if (!hooks) { /* Reset hooks */
        cJSON_malloc = malloc;
        cJSON_free = free;
        return;
    }

	cJSON_malloc = (hooks->malloc_fn)?hooks->malloc_fn:malloc;
	cJSON_free	 = (hooks->free_fn)?hooks->free_fn:free;
}